

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
               (Id<mathiu::impl::Pair> *idPat,int32_t depth,IdProcess idProcess)

{
  IdProcess idProcess_local;
  int32_t depth_local;
  Id<mathiu::impl::Pair> *idPat_local;
  
  if (idProcess == kCANCEL) {
    Id<mathiu::impl::Pair>::reset(idPat,depth);
  }
  else if (idProcess == kCONFIRM) {
    Id<mathiu::impl::Pair>::confirm(idPat,depth);
  }
  return;
}

Assistant:

constexpr static void processIdImpl(Id<Type> const &idPat, int32_t depth,
                                                IdProcess idProcess)
            {
                switch (idProcess)
                {
                case IdProcess::kCANCEL:
                    idPat.reset(depth);
                    break;

                case IdProcess::kCONFIRM:
                    idPat.confirm(depth);
                    break;
                }
            }